

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Call * __thiscall MixedArena::alloc<wasm::Call>(MixedArena *this)

{
  Call *pCVar1;
  
  pCVar1 = (Call *)allocSpace(this,0x48,8);
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id = CallId;
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pCVar1->operands).allocator = this;
  (pCVar1->target).super_IString.str._M_len = 0;
  (pCVar1->target).super_IString.str._M_str = (char *)0x0;
  pCVar1->isReturn = false;
  return pCVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }